

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpc_analyzer.cc
# Opt level: O0

void __thiscall
sptk::reaper::LpcAnalyzer::Autoc(LpcAnalyzer *this,int windowsize,float *s,int p,float *r,float *e)

{
  int in_ECX;
  float *in_RDX;
  int in_ESI;
  undefined4 *in_R8;
  undefined4 *in_R9;
  double dVar1;
  float sum0;
  float sum;
  float *t;
  float *q;
  int j;
  int i;
  float local_50;
  float local_4c;
  float *local_48;
  float *local_40;
  int local_38;
  int local_34;
  undefined4 *local_28;
  
  local_50 = 0.0;
  local_40 = in_RDX;
  local_34 = in_ESI;
  while (local_34 != 0) {
    local_50 = *local_40 * *local_40 + local_50;
    local_40 = local_40 + 1;
    local_34 = local_34 + -1;
  }
  *in_R8 = 0x3f800000;
  if ((local_50 != 0.0) || (NAN(local_50))) {
    dVar1 = std::sqrt((double)(ulong)(uint)(local_50 / (float)in_ESI));
    *in_R9 = SUB84(dVar1,0);
    local_28 = in_R8;
    for (local_34 = 1; local_34 <= in_ECX; local_34 = local_34 + 1) {
      local_4c = 0.0;
      local_48 = in_RDX + local_34;
      local_40 = in_RDX;
      local_38 = in_ESI - local_34;
      while (local_38 != 0) {
        local_4c = *local_40 * *local_48 + local_4c;
        local_48 = local_48 + 1;
        local_40 = local_40 + 1;
        local_38 = local_38 + -1;
      }
      local_28[1] = local_4c * (1.0 / local_50);
      local_28 = local_28 + 1;
    }
  }
  else {
    *in_R9 = 0x3f800000;
    for (local_34 = 1; local_34 <= in_ECX; local_34 = local_34 + 1) {
      in_R8[local_34] = 0;
    }
  }
  return;
}

Assistant:

void LpcAnalyzer::Autoc(int windowsize, float* s, int p, float* r, float* e) {
  int i, j;
  float *q, *t, sum, sum0;

  for (i = windowsize, q = s, sum0 = 0.0; i--;) {
    sum = *q++;
    sum0 += sum*sum;
  }
  *r = 1.;                      /* r[0] will always = 1.0 */
  if (sum0 == 0.0) {            /* No energy: fake low-energy white noise. */
    *e = 1.;                    /* Arbitrarily assign 1 to rms. */
    /* Now fake autocorrelation of white noise. */
    for (i = 1; i <= p; i++) {
      r[i] = 0.;
    }
    return;
  }
  *e = sqrt(sum0 / windowsize);
  sum0 = 1.0 / sum0;
  for (i = 1; i <= p; i++) {
    for (sum = 0.0, j = windowsize - i, q = s, t = s + i; j--;)
      sum += (*q++) * (*t++);
    *(++r) = sum * sum0;  // normalizing by the inverse energy
  }
}